

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall
CEditor::RenderBackground
          (CEditor *this,CUIRect View,CTextureHandle Texture,float Size,float Brightness)

{
  IGraphics *pIVar1;
  uint in_ESI;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  undefined4 in_XMM3_Da;
  CQuadItem QuadItem;
  CQuadItem local_20;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  pIVar1 = Graphics(in_RDI);
  local_10 = local_c;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x13])(pIVar1,(ulong)local_c);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])();
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x17])();
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x21])(in_XMM3_Da,in_XMM3_Da,in_XMM3_Da,0x3f800000);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1a])
            (0,0,in_XMM1_Da / in_XMM2_Da,in_XMM1_Db / in_XMM2_Da,pIVar1,0xffffffff);
  IGraphics::CQuadItem::CQuadItem(&local_20,in_XMM0_Da,in_XMM0_Db,in_XMM1_Da,in_XMM1_Db);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_20,1);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::RenderBackground(CUIRect View, IGraphics::CTextureHandle Texture, float Size, float Brightness)
{
	Graphics()->TextureSet(Texture);
	Graphics()->BlendNormal();
	Graphics()->QuadsBegin();
	Graphics()->SetColor(Brightness, Brightness, Brightness, 1.0f);
	Graphics()->QuadsSetSubset(0,0, View.w/Size, View.h/Size);
	IGraphics::CQuadItem QuadItem(View.x, View.y, View.w, View.h);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();
}